

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int quantize_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  uint32_t samples;
  float *in;
  uint32_t local_4c;
  float *local_48;
  float *local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  auVar12 = in_ZMM8._0_16_;
  puVar1 = (undefined8 *)segment->data;
  local_38 = ZEXT416(*(uint *)(puVar1 + 2));
  local_28 = ZEXT416(*(uint *)((long)puVar1 + 0x14));
  local_4c = 0xffffffff;
  buffer = (mixed_buffer *)*puVar1;
  buffer_00 = (mixed_buffer *)puVar1[1];
  mixed_buffer_request_read(&local_48,&local_4c,buffer);
  auVar7 = _DAT_002ae2c0;
  auVar6 = _DAT_002ae2a0;
  if (buffer == buffer_00) {
    uVar8 = (ulong)local_4c;
    if (uVar8 != 0) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar8 - 1;
      auVar10 = vpshufd_avx(auVar10,0x44);
      auVar3 = vpermilps_avx(local_38,0);
      auVar11._16_16_ = auVar3;
      auVar11._0_16_ = auVar3;
      auVar2 = vshufps_avx(local_28,local_28,0);
      auVar13 = ZEXT416((uint)(1.0 - local_28._0_4_));
      auVar13 = vshufps_avx(auVar13,auVar13,0);
      uVar9 = 0;
      uVar5 = auVar10._0_8_;
      auVar14._0_8_ = uVar5 ^ 0x8000000000000000;
      auVar14._8_4_ = auVar10._8_4_;
      uVar4 = auVar10._12_4_;
      auVar14._12_4_ = uVar4 ^ 0x80000000;
      auVar15._0_8_ = uVar5 ^ 0x8000000000000000;
      auVar15._8_4_ = auVar14._8_4_;
      auVar15._12_4_ = uVar4 ^ 0x80000000;
      auVar12 = vpcmpeqd_avx(auVar12,auVar12);
      auVar16._0_8_ = uVar5 ^ 0x8000000000000000;
      auVar16._8_4_ = auVar14._8_4_;
      auVar16._12_4_ = uVar4 ^ 0x80000000;
      do {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar9;
        auVar10 = vpshufd_avx(auVar17,0x44);
        auVar19._16_16_ = auVar10;
        auVar19._0_16_ = auVar10;
        auVar25 = vorps_avx(auVar19,auVar6);
        auVar19 = vorps_avx(auVar19,auVar7);
        auVar23._0_8_ = auVar19._16_8_ ^ 0x8000000000000000;
        auVar23._8_4_ = auVar19._24_4_;
        auVar23._12_4_ = auVar19._28_4_ ^ 0x80000000;
        auVar10 = vpcmpgtq_avx(auVar23,auVar14);
        auVar18._0_8_ = auVar19._0_8_ ^ 0x8000000000000000;
        auVar18._8_4_ = auVar19._8_4_;
        auVar18._12_4_ = auVar19._12_4_ ^ 0x80000000;
        auVar17 = vpcmpgtq_avx(auVar18,auVar15);
        auVar10 = vpackssdw_avx(auVar17,auVar10);
        auVar24._0_8_ = auVar25._16_8_ ^ 0x8000000000000000;
        auVar24._8_4_ = auVar25._24_4_;
        auVar24._12_4_ = auVar25._28_4_ ^ 0x80000000;
        auVar17 = vpcmpgtq_avx(auVar24,auVar14);
        auVar21._0_8_ = auVar25._0_8_ ^ 0x8000000000000000;
        auVar21._8_4_ = auVar25._8_4_;
        auVar21._12_4_ = auVar25._12_4_ ^ 0x80000000;
        auVar18 = vpcmpgtq_avx(auVar21,auVar16);
        auVar17 = vpackssdw_avx(auVar18,auVar17);
        auVar10 = vpackssdw_avx(auVar17 ^ auVar12,auVar10 ^ auVar12);
        auVar17 = vpmovsxwd_avx(auVar10);
        auVar10 = vpunpckhwd_avx(auVar10,auVar10);
        auVar20._16_16_ = auVar10;
        auVar20._0_16_ = auVar17;
        auVar19 = vmaskmovps_avx(auVar20,*(undefined1 (*) [32])(local_48 + uVar9));
        auVar25._0_4_ = auVar19._0_4_ * auVar3._0_4_;
        auVar25._4_4_ = auVar19._4_4_ * auVar3._4_4_;
        auVar25._8_4_ = auVar19._8_4_ * auVar3._8_4_;
        auVar25._12_4_ = auVar19._12_4_ * auVar3._12_4_;
        auVar25._16_4_ = auVar19._16_4_ * auVar3._0_4_;
        auVar25._20_4_ = auVar19._20_4_ * auVar3._4_4_;
        auVar25._24_4_ = auVar19._24_4_ * auVar3._8_4_;
        auVar25._28_4_ = 0;
        auVar25 = vroundps_avx(auVar25,9);
        auVar25 = vdivps_avx(auVar25,auVar11);
        auVar22._0_4_ = auVar19._0_4_ * auVar13._0_4_ + auVar25._0_4_ * auVar2._0_4_;
        auVar22._4_4_ = auVar19._4_4_ * auVar13._4_4_ + auVar25._4_4_ * auVar2._4_4_;
        auVar22._8_4_ = auVar19._8_4_ * auVar13._8_4_ + auVar25._8_4_ * auVar2._8_4_;
        auVar22._12_4_ = auVar19._12_4_ * auVar13._12_4_ + auVar25._12_4_ * auVar2._12_4_;
        auVar22._16_4_ = auVar19._16_4_ * auVar13._0_4_ + auVar25._16_4_ * auVar2._0_4_;
        auVar22._20_4_ = auVar19._20_4_ * auVar13._4_4_ + auVar25._20_4_ * auVar2._4_4_;
        auVar22._24_4_ = auVar19._24_4_ * auVar13._8_4_ + auVar25._24_4_ * auVar2._8_4_;
        auVar22._28_4_ = auVar19._28_4_ + auVar25._28_4_;
        auVar25 = vmaskmovps_avx(auVar20,auVar22);
        *(undefined1 (*) [32])(local_48 + uVar9) = auVar25;
        uVar9 = uVar9 + 8;
      } while ((uVar8 + 7 & 0xfffffffffffffff8) != uVar9);
    }
  }
  else {
    mixed_buffer_request_write(&local_40,&local_4c,buffer_00);
    if ((ulong)local_4c != 0) {
      uVar8 = 0;
      do {
        auVar12 = ZEXT416((uint)((float)local_38._0_4_ * local_48[uVar8]));
        auVar12 = vroundss_avx(auVar12,auVar12,9);
        local_40[uVar8] =
             local_48[uVar8] * (1.0 - (float)local_28._0_4_) +
             (float)local_28._0_4_ * (auVar12._0_4_ / (float)local_38._0_4_);
        uVar8 = uVar8 + 1;
      } while (local_4c != uVar8);
    }
    mixed_buffer_finish_read(local_4c,buffer);
    mixed_buffer_finish_write(local_4c,buffer_00);
  }
  return 1;
}

Assistant:

VECTORIZE int quantize_segment_mix(struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;

  float steps = data->steps;
  float mix = data->mix;
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float s = in[i];
      float o = floor(s * steps) / steps;
      out[i] = LERP(s, o, mix);
    });
  return 1;
}